

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtxParams_init_advanced
                 (ZSTD_CCtx_params *cctxParams,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  long in_RDI;
  ZSTD_parameters *in_stack_00000008;
  ZSTD_CCtx_params *in_stack_00000010;
  undefined4 in_stack_00000020;
  size_t err_code;
  undefined1 in_stack_ffffffffffffffb4 [12];
  size_t local_8;
  
  if (in_RDI == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    cParams._4_12_ = in_stack_ffffffffffffffb4;
    cParams.windowLog = in_stack_00000020;
    cParams._16_8_ = &stack0x00000008;
    cParams.strategy = (ZSTD_strategy)in_stack_00000008;
    local_8 = ZSTD_checkCParams(cParams);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      ZSTD_CCtxParams_init_internal(in_stack_00000010,in_stack_00000008,0);
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params* cctxParams, ZSTD_parameters params)
{
    RETURN_ERROR_IF(!cctxParams, GENERIC, "NULL pointer!");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_init_internal(cctxParams, &params, ZSTD_NO_CLEVEL);
    return 0;
}